

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

AActor * P_SpawnMissileXYZ(DVector3 *pos,AActor *source,AActor *dest,PClassActor *type,
                          bool checkspawn,AActor *owner)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  MetaClass *pMVar5;
  char *pcVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  AActor *local_f8;
  TFlags<ActorFlag4,_unsigned_int> local_bc;
  double local_b8;
  double newy;
  double newx;
  double s;
  double c;
  DAngle an;
  TVector3<double> local_88;
  undefined1 local_70 [4];
  TFlags<ActorFlag3,_unsigned_int> local_6c;
  undefined1 local_68 [8];
  DVector3 velocity;
  double speed;
  AActor *th;
  AActor *owner_local;
  bool checkspawn_local;
  PClassActor *type_local;
  AActor *dest_local;
  AActor *source_local;
  DVector3 *pos_local;
  
  if (source == (AActor *)0x0) {
    pos_local = (DVector3 *)0x0;
  }
  else if (dest == (AActor *)0x0) {
    pcVar4 = FName::GetChars(&(type->super_PClass).super_PStruct.super_PNamedType.TypeName);
    pMVar5 = AActor::GetClass(source);
    pcVar6 = FName::GetChars(&(pMVar5->super_PClass).super_PStruct.super_PNamedType.TypeName);
    Printf("P_SpawnMissilyXYZ: Tried to shoot %s from %s with no dest\n",pcVar4,pcVar6);
    pos_local = (DVector3 *)0x0;
  }
  else {
    if (((pos->Z != -2147483648.0) || (NAN(pos->Z))) && ((pos->Z != 2147483647.0 || (NAN(pos->Z)))))
    {
      pos->Z = pos->Z - source->Floorclip;
    }
    local_f8 = Spawn(type,pos,ALLOW_REPLACE);
    P_PlaySpawnSound(local_f8,source);
    th = owner;
    if (owner == (AActor *)0x0) {
      th = source;
    }
    TObjPtr<AActor>::operator=(&local_f8->target,th);
    velocity.Z = local_f8->Speed;
    AActor::Vec3To((DVector3 *)local_68,source,dest);
    operator|((EnumType)local_70,MF3_FLOORHUGGER);
    TFlags<ActorFlag3,_unsigned_int>::operator&(&local_6c,&local_f8->flags3);
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_6c);
    if (uVar2 == 0) {
      dVar1 = pos->Z;
      dVar8 = AActor::Z(source);
      if (dest->Height <= dVar1 - dVar8) {
        dVar1 = dest->Height;
        dVar8 = pos->Z;
        dVar9 = AActor::Z(source);
        velocity.Y = (dVar1 - dVar8) + dVar9 + velocity.Y;
      }
    }
    else {
      velocity.Y = 0.0;
    }
    TVector3<double>::Resized(&local_88,(TVector3<double> *)local_68,velocity.Z);
    TVector3<double>::operator=(&local_f8->Vel,&local_88);
    TFlags<ActorFlag,_unsigned_int>::operator&
              ((TFlags<ActorFlag,_unsigned_int> *)((long)&an.Degrees + 4),
               (int)dest + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&an.Degrees + 4));
    bVar7 = false;
    if (uVar2 != 0) {
      TFlags<ActorFlag6,_unsigned_int>::operator&
                ((TFlags<ActorFlag6,_unsigned_int> *)&an,
                 (int)source + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_BUMPSPECIAL));
      uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&an);
      bVar7 = uVar2 == 0;
    }
    if (bVar7) {
      iVar3 = FRandom::Random2(&pr_spawnmissile);
      TAngle<double>::TAngle((TAngle<double> *)&c,(double)iVar3 * 0.087890625);
      s = TAngle<double>::Cos((TAngle<double> *)&c);
      newx = TAngle<double>::Sin((TAngle<double> *)&c);
      newy = (local_f8->Vel).X * s - (local_f8->Vel).Y * newx;
      local_b8 = (local_f8->Vel).X * newx + (local_f8->Vel).Y * s;
      (local_f8->Vel).X = newy;
      (local_f8->Vel).Y = local_b8;
    }
    AActor::AngleFromVel(local_f8);
    TFlags<ActorFlag4,_unsigned_int>::operator&
              (&local_bc,
               (int)local_f8 + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_RANDOMIZE|MF4_BOSSDEATH));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_bc);
    if (uVar2 != 0) {
      AActor::SetFriendPlayer(local_f8,th->player);
    }
    if ((checkspawn) && (bVar7 = P_CheckMissileSpawn(local_f8,source->radius), !bVar7)) {
      local_f8 = (AActor *)0x0;
    }
    pos_local = (DVector3 *)local_f8;
  }
  return (AActor *)pos_local;
}

Assistant:

AActor *P_SpawnMissileXYZ (DVector3 pos, AActor *source, AActor *dest, PClassActor *type, bool checkspawn, AActor *owner)
{
	if (source == NULL)
	{
		return NULL;
	}

	if (dest == NULL)
	{
		Printf ("P_SpawnMissilyXYZ: Tried to shoot %s from %s with no dest\n",
			type->TypeName.GetChars(), source->GetClass()->TypeName.GetChars());
		return NULL;
	}

	if (pos.Z != ONFLOORZ && pos.Z != ONCEILINGZ)
	{
		pos.Z -= source->Floorclip;
	}

	AActor *th = Spawn (type, pos, ALLOW_REPLACE);
	
	P_PlaySpawnSound(th, source);

	// record missile's originator
	if (owner == NULL) owner = source;
	th->target = owner;

	double speed = th->Speed;

	// [RH]
	// Hexen calculates the missile velocity based on the source's location.
	// Would it be more useful to base it on the actual position of the
	// missile?
	// Answer: No, because this way, you can set up sets of parallel missiles.

	DVector3 velocity = source->Vec3To(dest);
	// Floor and ceiling huggers should never have a vertical component to their velocity
	if (th->flags3 & (MF3_FLOORHUGGER|MF3_CEILINGHUGGER))
	{
		velocity.Z = 0;
	}
	// [RH] Adjust the trajectory if the missile will go over the target's head.
	else if (pos.Z - source->Z() >= dest->Height)
	{
		velocity.Z += (dest->Height - pos.Z + source->Z());
	}
	th->Vel = velocity.Resized(speed);

	// invisible target: rotate velocity vector in 2D
	// [RC] Now monsters can aim at invisible player as if they were fully visible.
	if (dest->flags & MF_SHADOW && !(source->flags6 & MF6_SEEINVISIBLE))
	{
		DAngle an = pr_spawnmissile.Random2() * (22.5 / 256);
		double c = an.Cos();
		double s = an.Sin();
		
		double newx = th->Vel.X * c - th->Vel.Y * s;
		double newy = th->Vel.X * s + th->Vel.Y * c;

		th->Vel.X = newx;
		th->Vel.Y = newy;
	}

	th->AngleFromVel();

	if (th->flags4 & MF4_SPECTRAL)
	{
		th->SetFriendPlayer(owner->player);
	}

	return (!checkspawn || P_CheckMissileSpawn (th, source->radius)) ? th : NULL;
}